

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::abortRequest(QHttpThreadDelegate *this)

{
  if (*(QHttpNetworkReply **)(this + 0x150) != (QHttpNetworkReply *)0x0) {
    QHttpNetworkReply::abort(*(QHttpNetworkReply **)(this + 0x150));
    if (*(long **)(this + 0x150) != (long *)0x0) {
      (**(code **)(**(long **)(this + 0x150) + 0x20))();
    }
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (this[0x88] == (QHttpThreadDelegate)0x1) {
    *(undefined4 *)(this + 0xf0) = 4;
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x158),"quit",QueuedConnection);
    return;
  }
  QObject::deleteLater();
  return;
}

Assistant:

void QHttpThreadDelegate::abortRequest()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::abortRequest() thread=" << QThread::currentThreadId() << "sync=" << synchronous;
#endif
    if (httpReply) {
        httpReply->abort();
        delete httpReply;
        httpReply = nullptr;
    }

    // Got aborted by the timeout timer
    if (synchronous) {
        incomingErrorCode = QNetworkReply::TimeoutError;
        QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    } else {
        //only delete this for asynchronous mode or QNetworkAccessHttpBackend will crash - see QNetworkAccessHttpBackend::postRequest()
        this->deleteLater();
    }
}